

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O1

void __thiscall Optimizer::optimize(Optimizer *this,ScheduleHandle *origin,string *output_path)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Alloc_hider _Var3;
  Optimizer *pOVar4;
  string *path;
  pointer psVar5;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  char *pcVar11;
  shared_ptr<Schedule> *substitution;
  pointer s2;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<unsigned_long,_unsigned_long> pVar14;
  ScheduleHandle best;
  value_type top;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> substitutions;
  Comparator comparator;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  queue;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> hash_set;
  uint local_12c;
  string local_128;
  ScheduleHandle local_108;
  ScheduleHandle local_f8;
  Optimizer *local_e8;
  string *local_e0;
  long local_d8;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> local_d0;
  Comparator local_b8;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  local_a8;
  string local_80;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  pVar14 = Schedule::analyze((origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  local_b8.origin_time = pVar14.second;
  local_b8.limit = this->limit;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.field_2._M_allocated_capacity = 0;
  local_128._M_dataplus._M_p = (pointer)0x0;
  local_128._M_string_length = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::priority_queue(&local_a8,&local_b8,
                   (vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *
                   )&local_128);
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            ((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *)
             &local_128);
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::push(&local_a8,origin);
  local_128._M_dataplus._M_p =
       (pointer)Schedule::hash((origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>(&local_60,(unsigned_long *)&local_128);
  Schedule::info_abi_cxx11_
            (&local_128,(origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_e8 = this;
  local_e0 = output_path;
  printf(" > Start back-tracing search from source (%s)\n",local_128._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_d8 = std::chrono::_V2::system_clock::now();
  local_12c = 0;
  do {
    if (local_a8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_a8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((local_a8.c.
           super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((local_a8.c.
           super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
    ::pop(&local_a8);
    bVar6 = Comparator::considerable(&local_b8,&local_108,&local_f8);
    if (bVar6) {
      generateSubstitutions(&local_d0,&local_f8);
      psVar5 = local_d0.
               super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (s2 = local_d0.
                super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                ._M_impl.super__Vector_impl_data._M_start; s2 != psVar5; s2 = s2 + 1) {
        sVar7 = Schedule::hash((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              );
        p_Var9 = &p_Var1->_M_header;
        for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < sVar7]) {
          if (*(ulong *)(p_Var2 + 1) >= sVar7) {
            p_Var9 = p_Var2;
          }
        }
        p_Var10 = p_Var1;
        if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
           (p_Var10 = (_Rb_tree_header *)p_Var9, sVar7 < ((_Rb_tree_header *)p_Var9)->_M_node_count)
           ) {
          p_Var10 = p_Var1;
        }
        if (p_Var10 == p_Var1) {
          bVar6 = Comparator::considerable(&local_b8,&local_108,s2);
          if (bVar6) {
            std::
            priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
            ::push(&local_a8,s2);
            local_128._M_dataplus._M_p =
                 (pointer)Schedule::hash((s2->
                                         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_60,(unsigned_long *)&local_128);
          }
          bVar6 = Comparator::operator()(&local_b8,&local_108,s2);
          if (bVar6) {
            local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
          }
        }
      }
      pVar14 = Schedule::analyze(local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      local_12c = local_12c + 1;
      if ((local_b8.limit < pVar14.first) ||
         (auVar12._8_4_ = pVar14.second._4_4_, auVar12._0_8_ = pVar14.second,
         auVar12._12_4_ = 0x45300000, auVar13._8_4_ = (int)(local_b8.origin_time >> 0x20),
         auVar13._0_8_ = local_b8.origin_time, auVar13._12_4_ = 0x45300000,
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_b8.origin_time) - 4503599627370496.0)) * 1.01 <
         (auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)pVar14.second) - 4503599627370496.0))) {
        if (local_12c == 0x5dc) {
          puts(" > Reach search limit, stop searching");
          bVar6 = true;
        }
        else {
          if ((local_12c * -0x69d0369d + 0x1b4e818 >> 2 | local_12c * -0x40000000) < 0xda740d) {
            pretty_abi_cxx11_(&local_128,
                              (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->peak_memory,0x400,prettyBytes::units,4);
            _Var3._M_p = local_128._M_dataplus._M_p;
            prettyNanoseconds_abi_cxx11_
                      (&local_80,
                       (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       total_time);
            printf(" > Progress (%d): %s, %s\n",(ulong)local_12c,_Var3._M_p,
                   local_80._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar6 = false;
        }
      }
      else {
        puts(" > Already satisfy requirement, stop searching");
        bVar6 = true;
      }
      std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
                (&local_d0);
    }
    else {
      bVar6 = false;
    }
    if (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
  } while (!bVar6);
  puts(" > Result:");
  printf("   > Schedules searched: %d\n",(ulong)local_12c);
  lVar8 = std::chrono::_V2::system_clock::now();
  prettyNanoseconds_abi_cxx11_(&local_128,lVar8 - local_d8);
  printf("   > Time used: %s\n",local_128._M_dataplus._M_p);
  path = local_e0;
  pOVar4 = local_e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  Schedule::info_abi_cxx11_
            (&local_128,local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  printf("   > Best: {%s}\n",local_128._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = "true";
  if (pOVar4->limit <
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->peak_memory) {
    pcVar11 = "false";
  }
  printf("   > Satisfy memory: %s\n",pcVar11);
  printf(" > Writing result into path %s ... ",(path->_M_dataplus)._M_p);
  Schedule::restoreAndDumpToFile
            (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr,path);
  puts("OK!");
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            (&local_a8.c);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  if (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return;
}

Assistant:

void optimize(const ScheduleHandle &origin, const std::string &output_path) const {
        ScheduleHandle best = origin;
        auto comparator = Comparator{origin->analyze().second, limit};
        std::set<size_t> hash_set;
        std::priority_queue<ScheduleHandle, std::vector<ScheduleHandle>, Comparator> queue(comparator);

        // Source
        queue.push(origin);
        hash_set.insert(origin->hash());

        // Back-tracing search
        printf(" > Start back-tracing search from source (%s)\n", origin->info().c_str());
        Timer timer;
        int count = 0;
        while (not queue.empty()) {
            auto top = queue.top();
            queue.pop();

            if (not comparator.considerable(best, top)) {
                continue;
            }

            ++ count;

            // Substitute
            std::vector<ScheduleHandle> substitutions = generateSubstitutions(top);

            // Insert and check
            for (auto &substitution: substitutions) {
                if (hash_set.count(substitution->hash())) {
                    continue;
                }
                if (comparator.considerable(best, substitution)) {
                    queue.push(substitution);
                    hash_set.insert(substitution->hash());
                }
                if (comparator(best, substitution)) {
                    best = substitution;
                }
            }

            if (comparator.satisfy(best)) {
                printf(" > Already satisfy requirement, stop searching\n");
                break;
            }

            if (count == SEARCH_LIMIT) {
                printf(" > Reach search limit, stop searching\n");
                break;
            }

            if (count % PRINT_FREQUENCY == 0) {
                printf(" > Progress (%d): %s, %s\n", count, prettyBytes(top->peak_memory).c_str(), prettyNanoseconds(top->total_time).c_str());
            }
        }

        // Show best
        printf(" > Result:\n");
        printf("   > Schedules searched: %d\n", count);
        printf("   > Time used: %s\n", prettyNanoseconds(timer.tik()).c_str());
        printf("   > Best: {%s}\n", best->info().c_str());
        printf("   > Satisfy memory: %s\n", best->peak_memory <= limit ? "true" : "false");

        // Write result
        printf(" > Writing result into path %s ... ", output_path.c_str());
        best->restoreAndDumpToFile(output_path);
        printf("OK!\n");
    }